

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store.cc
# Opt level: O1

bool __thiscall bssl::CertificateTrust::IsDistrusted(CertificateTrust *this)

{
  if (this->type < (TRUSTED_LEAF|UNSPECIFIED)) {
    return (bool)(1 >> ((byte)this->type & 0x1f));
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store.cc"
                ,0x50,"bool bssl::CertificateTrust::IsDistrusted() const");
}

Assistant:

bool CertificateTrust::IsDistrusted() const {
  switch (type) {
    case CertificateTrustType::DISTRUSTED:
      return true;
    case CertificateTrustType::UNSPECIFIED:
    case CertificateTrustType::TRUSTED_ANCHOR:
    case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
    case CertificateTrustType::TRUSTED_LEAF:
      return false;
  }

  assert(0);  // NOTREACHED
  return false;
}